

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O1

bool __thiscall S2Polyline::Intersects(S2Polyline *this,S2Polyline *line)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  S2Point *pSVar5;
  S2Point *b;
  S2Point *c;
  int k;
  S2EdgeCrosser crosser;
  S2EdgeCrosser SStack_c8;
  S2LatLngRect local_58;
  
  if ((0 < this->num_vertices_) && (0 < line->num_vertices_)) {
    GetRectBound((S2LatLngRect *)&SStack_c8,this);
    GetRectBound(&local_58,line);
    bVar2 = S2LatLngRect::Intersects((S2LatLngRect *)&SStack_c8,&local_58);
    if (bVar2) {
      bVar2 = 1 < this->num_vertices_;
      if (this->num_vertices_ < 2) {
        return bVar2;
      }
      k = 1;
      do {
        pSVar5 = vertex(this,k + -1);
        b = vertex(this,k);
        c = vertex(line,0);
        S2EdgeCrosser::S2EdgeCrosser(&SStack_c8,pSVar5,b,c);
        bVar1 = 1 < line->num_vertices_;
        if (1 < line->num_vertices_) {
          pSVar5 = vertex(line,1);
          iVar3 = S2EdgeCrosser::CrossingSign(&SStack_c8,pSVar5);
          if (iVar3 < 0) {
            iVar3 = 2;
            do {
              bVar1 = iVar3 < line->num_vertices_;
              if (line->num_vertices_ <= iVar3) goto LAB_00213343;
              pSVar5 = vertex(line,iVar3);
              iVar4 = S2EdgeCrosser::CrossingSign(&SStack_c8,pSVar5);
              iVar3 = iVar3 + 1;
            } while (iVar4 < 0);
          }
          if (bVar1) {
            return bVar2;
          }
        }
LAB_00213343:
        k = k + 1;
        bVar2 = k < this->num_vertices_;
        if (this->num_vertices_ <= k) {
          return bVar2;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool S2Polyline::Intersects(const S2Polyline* line) const {
  if (num_vertices() <= 0 || line->num_vertices() <= 0) {
    return false;
  }

  if (!GetRectBound().Intersects(line->GetRectBound())) {
    return false;
  }

  // TODO(ericv): Use S2ShapeIndex here.
  for (int i = 1; i < num_vertices(); ++i) {
    S2EdgeCrosser crosser(
        &vertex(i - 1), &vertex(i), &line->vertex(0));
    for (int j = 1; j < line->num_vertices(); ++j) {
      if (crosser.CrossingSign(&line->vertex(j)) >= 0) {
        return true;
      }
    }
  }
  return false;
}